

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercomm.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  uint __seed;
  int iVar1;
  int iVar2;
  Master *pMVar3;
  MPI_Comm poVar4;
  Link *l;
  Master master;
  MPI_Comm intercomm;
  communicator local;
  bool producer;
  communicator world;
  environment env;
  MPI_Comm in_stack_ffffffffffffe758;
  function<void_(void_*,_diy::BinaryBuffer_&)> *in_stack_ffffffffffffe760;
  Master *this;
  undefined8 in_stack_ffffffffffffe778;
  int n_producers;
  ConsumerBlock *in_stack_ffffffffffffe780;
  undefined4 in_stack_ffffffffffffe788;
  undefined4 in_stack_ffffffffffffe78c;
  int in_stack_ffffffffffffe7d4;
  int gid__;
  anon_class_8_1_a83fce8b *in_stack_ffffffffffffe7f8;
  anon_class_8_1_a83fce8b *f;
  Master *in_stack_ffffffffffffe800;
  Master local_1708;
  undefined1 local_60 [8];
  communicator local_58;
  byte local_3d;
  communicator local_30;
  int local_4;
  
  n_producers = (int)((ulong)in_stack_ffffffffffffe778 >> 0x20);
  local_4 = 0;
  diy::mpi::environment::environment
            ((environment *)in_stack_ffffffffffffe760,
             (int)((ulong)in_stack_ffffffffffffe758 >> 0x20),(char **)0x10ed7d);
  diy::mpi::communicator::communicator((communicator *)in_stack_ffffffffffffe760);
  __seed = diy::mpi::communicator::rank(&local_30);
  srand(__seed);
  iVar1 = diy::mpi::communicator::rank(&local_30);
  iVar2 = diy::mpi::communicator::size(&local_30);
  local_3d = iVar1 < iVar2 / 2;
  diy::mpi::communicator::split
            ((communicator *)CONCAT44(in_stack_ffffffffffffe78c,in_stack_ffffffffffffe788),
             (int)((ulong)in_stack_ffffffffffffe780 >> 0x20),(int)in_stack_ffffffffffffe780);
  pMVar3 = (Master *)
           diy::mpi::communicator::operator_cast_to_ompi_communicator_t_((communicator *)0x10ee2c);
  poVar4 = diy::mpi::communicator::operator_cast_to_ompi_communicator_t_((communicator *)0x10ee43);
  if ((local_3d & 1) == 0) {
    iVar2 = 0;
  }
  else {
    in_stack_ffffffffffffe7d4 = diy::mpi::communicator::size(&local_30);
    iVar2 = in_stack_ffffffffffffe7d4 / 2;
  }
  MPI_Intercomm_create(pMVar3,0,poVar4,iVar2,0,local_60);
  gid__ = (int)((ulong)poVar4 >> 0x20);
  diy::mpi::communicator::communicator
            ((communicator *)in_stack_ffffffffffffe760,in_stack_ffffffffffffe758);
  std::function<void_*()>::function
            ((function<void_*()> *)in_stack_ffffffffffffe760,in_stack_ffffffffffffe758);
  std::function<void_(void_*)>::function
            ((function<void_(void_*)> *)in_stack_ffffffffffffe760,in_stack_ffffffffffffe758);
  std::function<void_(const_void_*,_diy::BinaryBuffer_&)>::function
            ((function<void_(const_void_*,_diy::BinaryBuffer_&)> *)in_stack_ffffffffffffe760,
             in_stack_ffffffffffffe758);
  std::function<void_(void_*,_diy::BinaryBuffer_&)>::function
            (in_stack_ffffffffffffe760,in_stack_ffffffffffffe758);
  l = (Link *)operator_new(0x10);
  diy::Master::QueueSizePolicy::QueueSizePolicy
            ((QueueSizePolicy *)in_stack_ffffffffffffe760,(size_t)in_stack_ffffffffffffe758);
  this = &local_1708;
  diy::Master::Master((Master *)master.mt_gen._M_x[0x168],(communicator *)master.mt_gen._M_x[0x167],
                      master.mt_gen._M_x[0x166]._4_4_,(int)master.mt_gen._M_x[0x166],
                      (CreateBlock *)master.mt_gen._M_x[0x165],
                      (DestroyBlock *)master.mt_gen._M_x[0x164],
                      (ExternalStorage *)master.mt_gen._M_x[0x16a],
                      (SaveBlock *)master.mt_gen._M_x[0x16b],(LoadBlock *)master.mt_gen._M_x[0x16c],
                      (QueuePolicy *)master.mt_gen._M_x[0x16d]);
  std::function<void_(void_*,_diy::BinaryBuffer_&)>::~function
            ((function<void_(void_*,_diy::BinaryBuffer_&)> *)0x10ef9b);
  std::function<void_(const_void_*,_diy::BinaryBuffer_&)>::~function
            ((function<void_(const_void_*,_diy::BinaryBuffer_&)> *)0x10efa8);
  std::function<void_(void_*)>::~function((function<void_(void_*)> *)0x10efb5);
  std::function<void_*()>::~function((function<void_*()> *)0x10efc2);
  diy::mpi::communicator::~communicator((communicator *)0x10efcf);
  if ((local_3d & 1) == 0) {
    diy::mpi::communicator::rank(&local_58);
    operator_new(0x20);
    diy::mpi::communicator::size(&local_30);
    ConsumerBlock::ConsumerBlock(in_stack_ffffffffffffe780,n_producers);
    operator_new(0x20);
    diy::Link::Link((Link *)this);
    diy::Master::add(pMVar3,gid__,(void *)CONCAT44(in_stack_ffffffffffffe7d4,iVar2),l);
    f = (anon_class_8_1_a83fce8b *)0x0;
    pMVar3 = (Master *)0x0;
    diy::MemoryManagement::MemoryManagement((MemoryManagement *)this);
    diy::Master::iexchange<main::__1>(pMVar3,f,(MemoryManagement *)CONCAT44(__seed,iVar1));
    diy::MemoryManagement::~MemoryManagement((MemoryManagement *)this);
  }
  else {
    diy::mpi::communicator::rank(&local_58);
    operator_new(1);
    operator_new(0x20);
    diy::Link::Link((Link *)this);
    diy::Master::add(pMVar3,gid__,(void *)CONCAT44(in_stack_ffffffffffffe7d4,iVar2),l);
    diy::MemoryManagement::MemoryManagement((MemoryManagement *)this);
    diy::Master::iexchange<main::__0>
              (in_stack_ffffffffffffe800,in_stack_ffffffffffffe7f8,
               (MemoryManagement *)CONCAT44(__seed,iVar1));
    diy::MemoryManagement::~MemoryManagement((MemoryManagement *)this);
  }
  diy::Master::~Master(this);
  diy::mpi::communicator::~communicator((communicator *)0x10f32f);
  diy::mpi::communicator::~communicator((communicator *)0x10f33c);
  diy::mpi::environment::~environment((environment *)0x10f349);
  return local_4;
}

Assistant:

int main(int argc, char* argv[])
{
    diy::mpi::environment   env(argc, argv); // equivalent of MPI_Init(argc, argv)/MPI_Finalize()
    diy::mpi::communicator  world;           // equivalent of MPI_COMM_WORLD

    srand(world.rank());

    bool producer = world.rank() < world.size() / 2;
    diy::mpi::communicator  local = world.split(producer);

    MPI_Comm intercomm;
    MPI_Intercomm_create(local, 0, world, /* remote_leader = */ producer ? world.size() / 2 : 0, /* tag = */ 0, &intercomm);

    diy::Master master(intercomm);
    if (producer)
    {
        master.add(local.rank(), new ProducerBlock, new diy::Link);

        // respond to queries
        master.iexchange([&local](ProducerBlock*, const diy::Master::ProxyWithLink& cp) -> bool
        {
            for (auto& x : *cp.incoming())
            {
                int   gid   = x.first;
                auto& queue = x.second;
                while (queue)
                {
                    int query;
                    diy::load(queue, query);

                    int response = query * local.rank();
                    cp.enqueue(diy::BlockID { gid, gid }, response);

                    fmt::print("[{} producer] received {} from {}; responded {}\n", local.rank(), query, gid, response);
                }
            }

            return true;       // done; producer never has any local work
        });
    } else
    {
        master.add(local.rank(), new ConsumerBlock(world.size()/2), new diy::Link);

        master.iexchange([&local](ConsumerBlock* b, const diy::Master::ProxyWithLink& cp) -> bool
        {
            // schedule 5 queries at a time
            for (int i = 0; i < 5 && b->cur < b->queries.size(); ++i, ++b->cur)
            {
                int target = b->queries[b->cur].first;
                int query  = b->queries[b->cur].second;
                cp.enqueue(diy::BlockID { target, target }, query);

                fmt::print("[{} consumer] Enqueueing {} to {}\n", local.rank(), query, target);
            }

            for (auto& x : *cp.incoming())
            {
                int   gid   = x.first;
                auto& queue = x.second;
                while (queue)
                {
                    int response;
                    diy::load(queue, response);
                    fmt::print("[{} consumer] Received {} from {}\n", local.rank(), response, gid);
                }
            }

            return b->cur == b->queries.size();
        });
    }
}